

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

btScalar __thiscall
btCollisionWorld::objectQuerySingleInternal::BridgeTriangleConvexcastCallback::reportHit
          (BridgeTriangleConvexcastCallback *this,btVector3 *hitNormalLocal,btVector3 *hitPointLocal
          ,btScalar hitFraction,int partId,int triangleIndex)

{
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  bool normalInWorldSpace;
  LocalConvexResult convexResult;
  LocalShapeInfo shapeInfo;
  LocalConvexResult local_70;
  LocalShapeInfo local_34 [6];
  float local_4;
  
  local_4 = in_XMM0_Da;
  if (in_XMM0_Da <= *(float *)(*(long *)(in_RDI + 0xe0) + 8)) {
    LocalConvexResult::LocalConvexResult
              (&local_70,*(btCollisionObject **)(in_RDI + 0xe8),local_34,in_RSI,in_RDX,in_XMM0_Da);
    local_4 = (float)(**(code **)(**(long **)(in_RDI + 0xe0) + 0x18))
                               (*(long **)(in_RDI + 0xe0),&local_70,1);
  }
  return local_4;
}

Assistant:

virtual btScalar reportHit(const btVector3& hitNormalLocal, const btVector3& hitPointLocal, btScalar hitFraction, int partId, int triangleIndex )
					{
						btCollisionWorld::LocalShapeInfo	shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{

							btCollisionWorld::LocalConvexResult convexResult
								(m_collisionObject,
								&shapeInfo,
								hitNormalLocal,
								hitPointLocal,
								hitFraction);

							bool	normalInWorldSpace = true;


							return m_resultCallback->addSingleResult(convexResult,normalInWorldSpace);
						}
						return hitFraction;
					}